

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *this;
  undefined1 local_c8 [8];
  Restaurant rest;
  allocator local_39;
  string local_38 [8];
  string configurationFile;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Restaurant::Restaurant((Restaurant *)local_c8,(string *)local_38);
    Restaurant::start((Restaurant *)local_c8);
    if (backup != (Restaurant *)0x0) {
      if (backup != (Restaurant *)0x0) {
        (*backup->_vptr_Restaurant[1])();
      }
      backup = (Restaurant *)0x0;
    }
    Restaurant::~Restaurant((Restaurant *)local_c8);
    std::__cxx11::string::~string(local_38);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"usage: rest <config_path>");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    if(argc!=2){
        std::cout << "usage: rest <config_path>" << std::endl;
        return 0;
    }
    string configurationFile = argv[1];
    Restaurant rest(configurationFile);
    rest.start();
    if(backup!=nullptr){
        delete backup;
        backup = nullptr;
    }
    return 0;
}